

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar2;
  ufile_config cfg;
  
  if (1 < argc) {
    getenv("UFILE_PUBLIC_KEY");
    getenv("UFILE_PRIVATE_KEY");
    puts(&DAT_001020dd);
    iVar2 = 1;
    iVar1 = ufile_sdk_initialize(1);
    if (iVar1 - 200U < 100 || iVar1 == 0) {
      printf(anon_var_dwarf_ba,argv[1]);
      iVar1 = ufile_delete("echotest2",argv[1]);
      if (iVar1 - 200U < 100 || iVar1 == 0) {
        puts(&DAT_001020f8);
      }
      else {
        printf(anon_var_dwarf_e6,extraout_RDX_00);
      }
      iVar2 = 0;
      ufile_sdk_cleanup();
    }
    else {
      ufile_sdk_cleanup();
      printf(anon_var_dwarf_a4,extraout_RDX);
    }
    return iVar2;
  }
  printf(anon_var_dwarf_27);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]){
    if(argc < 2){
        printf("请输入一个文件 key!!!");
        exit(1);
    }

    struct ufile_config cfg;
    cfg.public_key = getenv("UFILE_PUBLIC_KEY");
    cfg.private_key = getenv("UFILE_PRIVATE_KEY");
    cfg.bucket_host = "api.ucloud.cn";
    cfg.file_host = "cn-bj.ufileos.com";

    printf("正在初始化 SDK ......\n");
    struct ufile_error error;
    error = ufile_sdk_initialize(cfg, 1);
    if(UFILE_HAS_ERROR(error.code)){
        ufile_sdk_cleanup();
        printf("初始化 sdk 失败，错误信息为：%s\n", error.message);
        return 1;
    }
    printf("正在删除文件 %s\n", argv[1]);
    error = ufile_delete("echotest2", argv[1]);
    if(UFILE_HAS_ERROR(error.code)){
        printf("删除文件失败，错误信息为：%s\n", error.message);
    }else{
        printf("删除文件成功\n");
    }
    ufile_sdk_cleanup();
}